

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGhostObject.cpp
# Opt level: O3

void __thiscall
btGhostObject::rayTest
          (btGhostObject *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          RayResultCallback *resultCallback)

{
  btCollisionObject *collisionObject;
  int iVar1;
  long lVar2;
  btTransform rayToTrans;
  btTransform rayFromTrans;
  btTransform local_b0;
  btTransform local_70;
  
  local_70.m_basis.m_el[0].m_floats[0] = 1.0;
  local_70.m_basis.m_el[0].m_floats[1] = 0.0;
  local_70.m_basis.m_el[0].m_floats[2] = 0.0;
  local_70.m_basis.m_el[0].m_floats[3] = 0.0;
  local_70.m_basis.m_el[1].m_floats[0] = 0.0;
  local_70.m_basis.m_el[1].m_floats[1] = 1.0;
  local_70.m_basis.m_el[1].m_floats[2] = 0.0;
  local_70.m_basis.m_el[1].m_floats[3] = 0.0;
  local_70.m_basis.m_el[2].m_floats[0] = 0.0;
  local_70.m_basis.m_el[2].m_floats[1] = 0.0;
  local_70.m_basis.m_el[2].m_floats[2] = 1.0;
  local_70.m_basis.m_el[2].m_floats[3] = 0.0;
  local_70.m_origin.m_floats._0_8_ = *(undefined8 *)rayFromWorld->m_floats;
  local_70.m_origin.m_floats._8_8_ = *(undefined8 *)(rayFromWorld->m_floats + 2);
  local_b0.m_basis.m_el[0].m_floats[0] = 1.0;
  local_b0.m_basis.m_el[0].m_floats[1] = 0.0;
  local_b0.m_basis.m_el[0].m_floats[2] = 0.0;
  local_b0.m_basis.m_el[0].m_floats[3] = 0.0;
  local_b0.m_basis.m_el[1].m_floats[0] = 0.0;
  local_b0.m_basis.m_el[1].m_floats[1] = 1.0;
  local_b0.m_basis.m_el[1].m_floats[2] = 0.0;
  local_b0.m_basis.m_el[1].m_floats[3] = 0.0;
  local_b0.m_basis.m_el[2].m_floats[0] = 0.0;
  local_b0.m_basis.m_el[2].m_floats[1] = 0.0;
  local_b0.m_basis.m_el[2].m_floats[2] = 1.0;
  local_b0.m_basis.m_el[2].m_floats[3] = 0.0;
  local_b0.m_origin.m_floats._0_8_ = *(undefined8 *)rayToWorld->m_floats;
  local_b0.m_origin.m_floats._8_8_ = *(undefined8 *)(rayToWorld->m_floats + 2);
  if (0 < (this->m_overlappingObjects).m_size) {
    lVar2 = 0;
    do {
      collisionObject = (this->m_overlappingObjects).m_data[lVar2];
      iVar1 = (*resultCallback->_vptr_RayResultCallback[2])
                        (resultCallback,collisionObject->m_broadphaseHandle);
      if ((char)iVar1 != '\0') {
        btCollisionWorld::rayTestSingle
                  (&local_70,&local_b0,collisionObject,collisionObject->m_collisionShape,
                   &collisionObject->m_worldTransform,resultCallback);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->m_overlappingObjects).m_size);
  }
  return;
}

Assistant:

void	btGhostObject::rayTest(const btVector3& rayFromWorld, const btVector3& rayToWorld, btCollisionWorld::RayResultCallback& resultCallback) const
{
	btTransform rayFromTrans;
	rayFromTrans.setIdentity();
	rayFromTrans.setOrigin(rayFromWorld);
	btTransform  rayToTrans;
	rayToTrans.setIdentity();
	rayToTrans.setOrigin(rayToWorld);


	int i;
	for (i=0;i<m_overlappingObjects.size();i++)
	{
		btCollisionObject*	collisionObject= m_overlappingObjects[i];
		//only perform raycast if filterMask matches
		if(resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) 
		{
			btCollisionWorld::rayTestSingle(rayFromTrans,rayToTrans,
							collisionObject,
								collisionObject->getCollisionShape(),
								collisionObject->getWorldTransform(),
								resultCallback);
		}
	}
}